

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::SourceLocationTable::AddImport
          (SourceLocationTable *this,Message *descriptor,string *name,int line,int column)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_30 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48 = (undefined1  [8])descriptor;
  local_40._M_p = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  pmVar2 = std::
           map<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
           ::operator[](&this->import_location_map_,(key_type *)local_48);
  pmVar2->first = line;
  pmVar2->second = column;
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  return;
}

Assistant:

void SourceLocationTable::AddImport(const Message* descriptor,
                                    const std::string& name, int line,
                                    int column) {
  import_location_map_[std::make_pair(descriptor, name)] =
      std::make_pair(line, column);
}